

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O0

void skiwi::string_length(asmcode *code,operand string_reg)

{
  skiwi *this;
  uint64_t in_RDX;
  operation local_1d4 [2];
  operand local_1cc;
  operation local_1c8 [3];
  operand local_1bc [2];
  operation local_1b4;
  operand local_1b0 [2];
  operation local_1a8 [2];
  operand local_1a0;
  operation local_19c [3];
  operand local_190 [2];
  operation local_188;
  operand local_184 [2];
  operation local_17c [2];
  operand local_174;
  operation local_170 [3];
  operand local_164 [2];
  operation local_15c;
  operand local_158 [2];
  operation local_150 [2];
  operand local_148;
  operation local_144 [3];
  operand local_138 [2];
  operation local_130;
  operand local_12c [2];
  operation local_124 [2];
  operand local_11c;
  operation local_118 [3];
  operand local_10c [2];
  operation local_104;
  operand local_100 [2];
  operation local_f8 [2];
  operand local_f0;
  operation local_ec [3];
  operand local_e0 [2];
  operation local_d8;
  operand local_d4 [2];
  operation local_cc [2];
  operand local_c4;
  operation local_c0 [3];
  operand local_b4 [2];
  operation local_ac;
  operand local_a8 [2];
  operation local_a0 [2];
  operand local_98 [2];
  operation local_90;
  operand local_8c;
  operation local_88 [2];
  operand local_80 [2];
  operation local_78;
  operand local_74 [2];
  operation local_6c;
  long local_68;
  operand local_60 [2];
  operation local_58 [5];
  operand local_44 [2];
  operation local_3c;
  undefined1 local_38 [8];
  string stringlengthdone;
  operand string_reg_local;
  asmcode *code_local;
  
  this = label;
  label = label + 1;
  stringlengthdone.field_2._12_4_ = string_reg;
  label_to_string_abi_cxx11_((string *)local_38,this,in_RDX);
  local_3c = MOV;
  local_44[1] = 0x18;
  local_44[0] = get_mem_operand(stringlengthdone.field_2._12_4_);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_3c,local_44 + 1,local_44);
  local_58[0] = MOV;
  local_60[1] = 0x14;
  local_60[0] = NUMBER;
  local_68 = 0xffffffffffffff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,local_58,local_60 + 1,local_60,&local_68);
  local_6c = AND;
  local_74[1] = 0x18;
  local_74[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_6c,local_74 + 1,local_74);
  local_78 = SHL;
  local_80[1] = 0x18;
  local_80[0] = NUMBER;
  local_88[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_78,local_80 + 1,local_80,(int *)(local_88 + 1));
  local_88[0] = ADD;
  local_8c = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand&,assembler::asmcode::operand>
            (code,local_88,(operand *)(stringlengthdone.field_2._M_local_buf + 0xc),&local_8c);
  local_90 = SUB;
  local_98[1] = 0x18;
  local_98[0] = NUMBER;
  local_a0[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_90,local_98 + 1,local_98,(int *)(local_a0 + 1));
  local_a0[0] = MOV;
  local_a8[1] = 1;
  local_a8[0] = get_byte_mem_operand(stringlengthdone.field_2._12_4_);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_a0,local_a8 + 1,local_a8);
  local_ac = CMP;
  local_b4[1] = 1;
  local_b4[0] = NUMBER;
  local_c0[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_ac,local_b4 + 1,local_b4,(int *)(local_c0 + 2));
  local_c0[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_c0 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_c0[0] = INC;
  local_c4 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_c0,&local_c4);
  local_cc[1] = 0x2b;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_cc + 1,(operand *)(stringlengthdone.field_2._M_local_buf + 0xc));
  local_cc[0] = MOV;
  local_d4[1] = 1;
  local_d4[0] = get_byte_mem_operand(stringlengthdone.field_2._12_4_);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_cc,local_d4 + 1,local_d4);
  local_d8 = CMP;
  local_e0[1] = 1;
  local_e0[0] = NUMBER;
  local_ec[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_d8,local_e0 + 1,local_e0,(int *)(local_ec + 2));
  local_ec[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_ec + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_ec[0] = INC;
  local_f0 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_ec,&local_f0);
  local_f8[1] = 0x2b;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_f8 + 1,(operand *)(stringlengthdone.field_2._M_local_buf + 0xc));
  local_f8[0] = MOV;
  local_100[1] = 1;
  local_100[0] = get_byte_mem_operand(stringlengthdone.field_2._12_4_);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_f8,local_100 + 1,local_100);
  local_104 = CMP;
  local_10c[1] = 1;
  local_10c[0] = NUMBER;
  local_118[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_104,local_10c + 1,local_10c,(int *)(local_118 + 2));
  local_118[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_118 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_118[0] = INC;
  local_11c = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_118,&local_11c);
  local_124[1] = 0x2b;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_124 + 1,(operand *)(stringlengthdone.field_2._M_local_buf + 0xc));
  local_124[0] = MOV;
  local_12c[1] = 1;
  local_12c[0] = get_byte_mem_operand(stringlengthdone.field_2._12_4_);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_124,local_12c + 1,local_12c);
  local_130 = CMP;
  local_138[1] = 1;
  local_138[0] = NUMBER;
  local_144[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_130,local_138 + 1,local_138,(int *)(local_144 + 2));
  local_144[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_144 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_144[0] = INC;
  local_148 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_144,&local_148);
  local_150[1] = 0x2b;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_150 + 1,(operand *)(stringlengthdone.field_2._M_local_buf + 0xc));
  local_150[0] = MOV;
  local_158[1] = 1;
  local_158[0] = get_byte_mem_operand(stringlengthdone.field_2._12_4_);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_150,local_158 + 1,local_158);
  local_15c = CMP;
  local_164[1] = 1;
  local_164[0] = NUMBER;
  local_170[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_15c,local_164 + 1,local_164,(int *)(local_170 + 2));
  local_170[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_170 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_170[0] = INC;
  local_174 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_170,&local_174);
  local_17c[1] = 0x2b;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_17c + 1,(operand *)(stringlengthdone.field_2._M_local_buf + 0xc));
  local_17c[0] = MOV;
  local_184[1] = 1;
  local_184[0] = get_byte_mem_operand(stringlengthdone.field_2._12_4_);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_17c,local_184 + 1,local_184);
  local_188 = CMP;
  local_190[1] = 1;
  local_190[0] = NUMBER;
  local_19c[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_188,local_190 + 1,local_190,(int *)(local_19c + 2));
  local_19c[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_19c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_19c[0] = INC;
  local_1a0 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_19c,&local_1a0);
  local_1a8[1] = 0x2b;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_1a8 + 1,(operand *)(stringlengthdone.field_2._M_local_buf + 0xc));
  local_1a8[0] = MOV;
  local_1b0[1] = 1;
  local_1b0[0] = get_byte_mem_operand(stringlengthdone.field_2._12_4_);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1a8,local_1b0 + 1,local_1b0);
  local_1b4 = CMP;
  local_1bc[1] = 1;
  local_1bc[0] = NUMBER;
  local_1c8[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1b4,local_1bc + 1,local_1bc,(int *)(local_1c8 + 2));
  local_1c8[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1c8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_1c8[0] = INC;
  local_1cc = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1c8,&local_1cc);
  local_1d4[1] = 0x2b;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_1d4 + 1,(operand *)(stringlengthdone.field_2._M_local_buf + 0xc));
  local_1d4[0] = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1d4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void string_length(asmcode& code, asmcode::operand string_reg)
  {
  /*
  input points to a scheme string (thus not char* or const char*, see string_length_raw)
  clobbers rax, r11, r15, and string_reg
  result is in r15
  string_reg points to the string
  */
  std::string stringlengthdone = label_to_string(label++);

  code.add(asmcode::MOV, asmcode::R15, get_mem_operand(string_reg));
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, block_size_mask);
  code.add(asmcode::AND, asmcode::R15, asmcode::R11);
  code.add(asmcode::SHL, asmcode::R15, asmcode::NUMBER, 3);
  code.add(asmcode::ADD, string_reg, asmcode::R15);
  code.add(asmcode::SUB, asmcode::R15, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::LABEL, stringlengthdone);
  // r15 now contains the string length
  }